

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<phmap::btree_set<int,std::greater<int>,std::allocator<int>>,void>
               (btree_set<int,_std::greater<int>,_std::allocator<int>_> *container,ostream *os)

{
  template_ElementType<2UL> *ptVar1;
  long lVar2;
  int iVar3;
  btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *this;
  const_iterator cVar4;
  const_iterator cVar5;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_40;
  
  std::operator<<(os,'{');
  cVar4 = phmap::priv::
          btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          begin((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *)container);
  local_40.node = cVar4.node;
  local_40.position = cVar4.position;
  cVar5 = phmap::priv::
          btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          end((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
               *)container);
  lVar2 = 0;
  this = (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *
         )cVar4.node;
  iVar3 = cVar4.position;
  do {
    if (iVar3 == cVar5.position &&
        this == (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                 *)cVar5.node) {
      if (lVar2 != 0) {
LAB_0026f330:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    ptVar1 = phmap::priv::
             btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>(this);
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_0026f330;
    }
    std::operator<<(os,' ');
    ((void)((*{parm#2})<<{parm#1}))testing::internal::
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::PrintValue<int,void>
              (ptVar1 + iVar3,os);
    lVar2 = lVar2 + 1;
    phmap::priv::
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::increment(&local_40);
    this = (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
            *)local_40.node;
    iVar3 = local_40.position;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }